

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.hpp
# Opt level: O2

ValueEntryIterator<rsg::IsWritableEntry> * __thiscall
rsg::VariableManager::getBegin<rsg::IsWritableEntry>
          (ValueEntryIterator<rsg::IsWritableEntry> *__return_storage_ptr__,VariableManager *this)

{
  Storage SVar1;
  ValueEntry **ppVVar2;
  ValueEntry **ppVVar3;
  
  ppVVar3 = (this->m_entryCache).
            super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppVVar2 = (this->m_entryCache).
            super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  while ((ppVVar3 != ppVVar2 &&
         ((SVar1 = (*ppVVar3)->m_variable->m_storage, STORAGE_PARAMETER_INOUT < SVar1 ||
          ((0xe5U >> (SVar1 & 0x1f) & 1) == 0))))) {
    ppVVar3 = ppVVar3 + 1;
  }
  (__return_storage_ptr__->
  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
  ).m_iter._M_current = ppVVar3;
  (__return_storage_ptr__->
  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
  ).m_end._M_current = ppVVar2;
  return __return_storage_ptr__;
}

Assistant:

ValueEntryIterator<Filter> VariableManager::getBegin (Filter filter) const
{
	std::vector<const ValueEntry*>::const_iterator first = m_entryCache.begin();
	while (first != m_entryCache.end() && !filter(*first))
		first++;
	return ValueEntryIterator<Filter>(first, m_entryCache.end(), filter);
}